

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O1

void __thiscall Fl_Browser_::bbox(Fl_Browser_ *this,int *X,int *Y,int *W,int *H)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  Fl_Boxtype t;
  
  iVar3 = this->scrollbar_size_;
  if (iVar3 == 0) {
    iVar3 = Fl::scrollbar_size();
  }
  bVar1 = (this->super_Fl_Group).super_Fl_Widget.box_;
  bVar5 = 3;
  if (bVar1 != 0) {
    bVar5 = bVar1;
  }
  t = (Fl_Boxtype)bVar5;
  iVar2 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar4 = Fl::box_dx(t);
  *X = iVar4 + iVar2;
  iVar2 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar4 = Fl::box_dy((uint)bVar5);
  *Y = iVar4 + iVar2;
  iVar2 = (this->super_Fl_Group).super_Fl_Widget.w_;
  iVar4 = Fl::box_dw(t);
  *W = iVar2 - iVar4;
  iVar2 = (this->super_Fl_Group).super_Fl_Widget.h_;
  iVar4 = Fl::box_dh(t);
  *H = iVar2 - iVar4;
  if ((((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) &&
     (*W = *W - iVar3,
     ((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_ & 4) != 0))
  {
    *X = *X + iVar3;
  }
  if (*W < 0) {
    *W = 0;
  }
  if ((((this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) &&
     (*H = *H - iVar3,
     ((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_ & 1) != 0))
  {
    *Y = *Y + iVar3;
  }
  if (*H < 0) {
    *H = 0;
  }
  return;
}

Assistant:

void Fl_Browser_::bbox(int& X, int& Y, int& W, int& H) const {
  int scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
  Fl_Boxtype b = box() ? box() : FL_DOWN_BOX;
  X = x()+Fl::box_dx(b);
  Y = y()+Fl::box_dy(b);
  W = w()-Fl::box_dw(b);
  H = h()-Fl::box_dh(b);
  if (scrollbar.visible()) {
    W -= scrollsize;
    if (scrollbar.align() & FL_ALIGN_LEFT) X += scrollsize;
  }
  if (W < 0) W = 0;
  if (hscrollbar.visible()) {
    H -= scrollsize;
    if (scrollbar.align() & FL_ALIGN_TOP) Y += scrollsize;
  }
  if (H < 0) H = 0;
}